

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.c
# Opt level: O3

int ixmlNode_insertBefore(IXML_Node *nodeptr,IXML_Node *newChild,IXML_Node *refChild)

{
  Nodeptr p_Var1;
  int iVar2;
  int iVar3;
  Nodeptr local_30;
  
  iVar3 = 0x69;
  if (newChild != (IXML_Node *)0x0 && nodeptr != (IXML_Node *)0x0) {
    local_30 = newChild;
    iVar2 = ixmlNode_allowChildren(nodeptr,newChild);
    iVar3 = 3;
    if (iVar2 != 0) {
      iVar2 = ixmlNode_isAncestor(newChild,nodeptr);
      if ((iVar2 == 0) && (iVar3 = 4, nodeptr->ownerDocument == newChild->ownerDocument)) {
        if (refChild == (IXML_Node *)0x0) {
          __assert_fail("nodeptr != NULL && toFind != NULL",
                        "/workspace/llm4binary/github/license_c_cmakelists/pupnp[P]pupnp/ixml/src/node.c"
                        ,0x1c7,"int ixmlNode_isParent(IXML_Node *, IXML_Node *)");
        }
        iVar3 = 8;
        if (refChild->parentNode == nodeptr) {
          if (newChild->parentNode == nodeptr) {
            ixmlNode_removeChild(nodeptr,newChild,&local_30);
            local_30->prevSibling = (Nodeptr)0x0;
            local_30->nextSibling = (Nodeptr)0x0;
            newChild = local_30;
          }
          newChild->nextSibling = refChild;
          p_Var1 = refChild->prevSibling;
          if (p_Var1 != (Nodeptr)0x0) {
            p_Var1->nextSibling = newChild;
            newChild->prevSibling = p_Var1;
          }
          refChild->prevSibling = newChild;
          if (newChild->prevSibling == (Nodeptr)0x0) {
            nodeptr->firstChild = newChild;
          }
          newChild->parentNode = nodeptr;
          iVar3 = 0;
        }
      }
    }
  }
  return iVar3;
}

Assistant:

int ixmlNode_insertBefore(
	IXML_Node *nodeptr, IXML_Node *newChild, IXML_Node *refChild)
{
	int ret = IXML_SUCCESS;

	if (nodeptr == NULL || newChild == NULL) {
		return IXML_INVALID_PARAMETER;
	}
	/* whether nodeptr allow children of the type of newChild */
	if (ixmlNode_allowChildren(nodeptr, newChild) == 0) {
		return IXML_HIERARCHY_REQUEST_ERR;
	}
	/* or if newChild is one of nodeptr's ancestors */
	if (ixmlNode_isAncestor(newChild, nodeptr)) {
		return IXML_HIERARCHY_REQUEST_ERR;
	}
	/* if newChild was created from a different document */
	if (nodeptr->ownerDocument != newChild->ownerDocument) {
		return IXML_WRONG_DOCUMENT_ERR;
	}
	/* if refChild is not a child of nodeptr */
	if (ixmlNode_isParent(nodeptr, refChild) == 0) {
		return IXML_NOT_FOUND_ERR;
	}

	if (refChild != NULL) {
		if (ixmlNode_isParent(nodeptr, newChild)) {
			ixmlNode_removeChild(nodeptr, newChild, &newChild);
			newChild->nextSibling = NULL;
			newChild->prevSibling = NULL;
		}
		newChild->nextSibling = refChild;
		if (refChild->prevSibling != NULL) {
			refChild->prevSibling->nextSibling = newChild;
			newChild->prevSibling = refChild->prevSibling;
		}
		refChild->prevSibling = newChild;
		if (newChild->prevSibling == NULL) {
			nodeptr->firstChild = newChild;
		}
		newChild->parentNode = nodeptr;
	} else {
		ret = ixmlNode_appendChild(nodeptr, newChild);
	}

	return ret;
}